

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O2

Result __thiscall wabt::anon_unknown_4::Validator::CheckModule(Validator *this)

{
  ModuleFieldList *pMVar1;
  SharedValidator *this_00;
  TypeEntryKind TVar2;
  ExprType EVar3;
  TypeEntry *base;
  Type *pTVar4;
  Type *result_types;
  pointer pFVar5;
  Import *base_00;
  ModuleField *pMVar6;
  Enum *pEVar7;
  undefined4 uVar8;
  undefined1 uVar9;
  string_view name;
  size_type sVar10;
  Module *pMVar11;
  bool bVar12;
  Result RVar13;
  reference pMVar14;
  FuncType *pFVar15;
  StructType *pSVar16;
  ArrayType *pAVar17;
  FuncImport *pFVar18;
  EventImport *pEVar19;
  MemoryImport *pMVar20;
  GlobalImport *pGVar21;
  TableImport *pTVar22;
  const_reference pvVar23;
  ConstExpr *pCVar24;
  VarExpr<(wabt::ExprType)19> *pVVar25;
  VarExpr<(wabt::ExprType)35> *pVVar26;
  RefTypeExpr<(wabt::ExprType)36> *pRVar27;
  TypeMut field_00;
  Var *pVVar28;
  Location *pLVar29;
  Field *field;
  pointer pFVar30;
  Enum *pEVar31;
  ElemExpr *elem_expr;
  ModuleField *pMVar32;
  const_iterator rhs;
  const_iterator rhs_00;
  const_iterator rhs_01;
  const_iterator rhs_02;
  const_iterator rhs_03;
  const_iterator rhs_04;
  const_iterator rhs_05;
  const_iterator rhs_06;
  const_iterator rhs_07;
  const_iterator rhs_08;
  const_iterator rhs_09;
  const_iterator rhs_10;
  ModuleFieldList *__range2;
  const_iterator __begin2;
  TypeMutVector type_muts;
  Index local_460;
  const_iterator local_450;
  TypeMut local_440;
  undefined1 local_438 [88];
  Module *local_3e0;
  Var local_3d8;
  Var local_390;
  Var local_348;
  Var local_300;
  Var local_2b8;
  Var local_270;
  Var local_228;
  Var local_1e0;
  Var local_198;
  Var local_150;
  Var local_108;
  Var local_c0;
  Var local_78;
  
  local_3e0 = this->current_module_;
  pMVar1 = &local_3e0->fields;
  local_450.node_ = (local_3e0->fields).first_;
  this_00 = &this->validator_;
  local_450.list_ = pMVar1;
  while( true ) {
    rhs.node_ = (ModuleField *)0x0;
    rhs.list_ = pMVar1;
    bVar12 = intrusive_list<wabt::ModuleField>::const_iterator::operator!=(&local_450,rhs);
    if (!bVar12) break;
    pMVar14 = intrusive_list<wabt::ModuleField>::const_iterator::operator*(&local_450);
    if (pMVar14->type_ == Type) {
      base = (TypeEntry *)pMVar14[1]._vptr_ModuleField;
      TVar2 = base->kind_;
      if (TVar2 == Array) {
        pAVar17 = cast<wabt::ArrayType,wabt::TypeEntry>(base);
        uVar8 = (pAVar17->field).type;
        uVar9 = (pAVar17->field).mutable_;
        field_00.mutable_ = (bool)uVar9;
        field_00.type.enum_ = uVar8;
        field_00._5_3_ = 0;
        RVar13 = SharedValidator::OnArrayType(this_00,&pMVar14->loc,field_00);
LAB_0015aec9:
        (this->result_).enum_ = (uint)(RVar13.enum_ == Error || (this->result_).enum_ == Error);
      }
      else if (TVar2 == Struct) {
        pSVar16 = cast<wabt::StructType,wabt::TypeEntry>(base);
        local_438._16_8_ = 0;
        local_438._0_8_ = (intrusive_list<wabt::ModuleField> *)0x0;
        local_438._8_8_ = (ModuleField *)0x0;
        pFVar5 = (pSVar16->fields).super__Vector_base<wabt::Field,_std::allocator<wabt::Field>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        for (pFVar30 = (pSVar16->fields).
                       super__Vector_base<wabt::Field,_std::allocator<wabt::Field>_>._M_impl.
                       super__Vector_impl_data._M_start; pFVar30 != pFVar5; pFVar30 = pFVar30 + 1) {
          local_440.type.enum_ = (pFVar30->type).enum_;
          local_440.mutable_ = pFVar30->mutable_;
          std::vector<wabt::TypeMut,_std::allocator<wabt::TypeMut>_>::emplace_back<wabt::TypeMut>
                    ((vector<wabt::TypeMut,_std::allocator<wabt::TypeMut>_> *)local_438,&local_440);
        }
        RVar13 = SharedValidator::OnStructType
                           (this_00,&pMVar14->loc,
                            (Index)((ulong)(local_438._8_8_ - local_438._0_8_) >> 3),
                            (TypeMut *)local_438._0_8_);
        (this->result_).enum_ = (uint)(RVar13.enum_ == Error || (this->result_).enum_ == Error);
        std::_Vector_base<wabt::TypeMut,_std::allocator<wabt::TypeMut>_>::~_Vector_base
                  ((_Vector_base<wabt::TypeMut,_std::allocator<wabt::TypeMut>_> *)local_438);
      }
      else if (TVar2 == Func) {
        pFVar15 = cast<wabt::FuncType,wabt::TypeEntry>(base);
        pTVar4 = (pFVar15->sig).param_types.
                 super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                 super__Vector_impl_data._M_start;
        result_types = (pFVar15->sig).result_types.
                       super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                       super__Vector_impl_data._M_start;
        RVar13 = SharedValidator::OnFuncType
                           (this_00,&pMVar14->loc,
                            (Index)((ulong)((long)(pFVar15->sig).param_types.
                                                  super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                           (long)pTVar4) >> 2),pTVar4,
                            (Index)((ulong)((long)(pFVar15->sig).result_types.
                                                  super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                           (long)result_types) >> 2),result_types);
        goto LAB_0015aec9;
      }
    }
    intrusive_list<wabt::ModuleField>::const_iterator::operator++(&local_450);
  }
  local_438._8_8_ = pMVar1->first_;
  local_438._0_8_ = pMVar1;
  while (rhs_00.node_ = (ModuleField *)0x0, rhs_00.list_ = pMVar1,
        bVar12 = intrusive_list<wabt::ModuleField>::const_iterator::operator!=
                           ((const_iterator *)local_438,rhs_00), bVar12) {
    pMVar14 = intrusive_list<wabt::ModuleField>::const_iterator::operator*
                        ((const_iterator *)local_438);
    if (pMVar14->type_ != Import) goto switchD_0015af4b_default;
    base_00 = (Import *)pMVar14[1]._vptr_ModuleField;
    switch(base_00->kind_) {
    case First:
      pFVar18 = cast<wabt::FuncImport,wabt::Import>(base_00);
      pVVar28 = &local_78;
      GetFuncTypeIndex(pVVar28,this,&pMVar14->loc,&(pFVar18->func).decl);
      RVar13 = SharedValidator::OnFunction(this_00,&pMVar14->loc,pVVar28);
      goto LAB_0015afb3;
    case Table:
      pTVar22 = cast<wabt::TableImport,wabt::Import>(base_00);
      RVar13 = SharedValidator::OnTable
                         (this_00,&pMVar14->loc,(Type)(pTVar22->table).elem_type.enum_,
                          &(pTVar22->table).elem_limits);
      break;
    case Memory:
      pMVar20 = cast<wabt::MemoryImport,wabt::Import>(base_00);
      RVar13 = SharedValidator::OnMemory(this_00,&pMVar14->loc,&(pMVar20->memory).page_limits);
      break;
    case Global:
      pGVar21 = cast<wabt::GlobalImport,wabt::Import>(base_00);
      RVar13 = SharedValidator::OnGlobalImport
                         (this_00,&pMVar14->loc,(Type)(pGVar21->global).type.enum_,
                          (pGVar21->global).mutable_);
      break;
    case Event:
      pEVar19 = cast<wabt::EventImport,wabt::Import>(base_00);
      pVVar28 = &local_c0;
      GetFuncTypeIndex(pVVar28,this,&pMVar14->loc,&(pEVar19->event).decl);
      RVar13 = SharedValidator::OnEvent(this_00,&pMVar14->loc,pVVar28);
LAB_0015afb3:
      (this->result_).enum_ = (uint)(RVar13.enum_ == Error || (this->result_).enum_ == Error);
      Var::~Var(pVVar28);
    default:
      goto switchD_0015af4b_default;
    }
    (this->result_).enum_ = (uint)(RVar13.enum_ == Error || (this->result_).enum_ == Error);
switchD_0015af4b_default:
    intrusive_list<wabt::ModuleField>::const_iterator::operator++((const_iterator *)local_438);
  }
  local_438._8_8_ = pMVar1->first_;
  local_438._0_8_ = pMVar1;
  while (rhs_01.node_ = (ModuleField *)0x0, rhs_01.list_ = pMVar1,
        bVar12 = intrusive_list<wabt::ModuleField>::const_iterator::operator!=
                           ((const_iterator *)local_438,rhs_01), bVar12) {
    pMVar14 = intrusive_list<wabt::ModuleField>::const_iterator::operator*
                        ((const_iterator *)local_438);
    if (pMVar14->type_ == Func) {
      GetFuncTypeIndex(&local_108,this,&pMVar14->loc,
                       (FuncDeclaration *)&pMVar14[1].loc.filename.size_);
      RVar13 = SharedValidator::OnFunction(this_00,&pMVar14->loc,&local_108);
      (this->result_).enum_ = (uint)(RVar13.enum_ == Error || (this->result_).enum_ == Error);
      Var::~Var(&local_108);
    }
    intrusive_list<wabt::ModuleField>::const_iterator::operator++((const_iterator *)local_438);
  }
  local_438._8_8_ = pMVar1->first_;
  local_438._0_8_ = pMVar1;
  while (rhs_02.node_ = (ModuleField *)0x0, rhs_02.list_ = pMVar1,
        bVar12 = intrusive_list<wabt::ModuleField>::const_iterator::operator!=
                           ((const_iterator *)local_438,rhs_02), bVar12) {
    pMVar14 = intrusive_list<wabt::ModuleField>::const_iterator::operator*
                        ((const_iterator *)local_438);
    if (pMVar14->type_ == Table) {
      RVar13 = SharedValidator::OnTable
                         (this_00,&pMVar14->loc,(Type)pMVar14[1].type_,
                          (Limits *)&pMVar14[1].loc.filename.size_);
      (this->result_).enum_ = (uint)(RVar13.enum_ == Error || (this->result_).enum_ == Error);
    }
    intrusive_list<wabt::ModuleField>::const_iterator::operator++((const_iterator *)local_438);
  }
  local_438._8_8_ = pMVar1->first_;
  local_438._0_8_ = pMVar1;
  while (rhs_03.node_ = (ModuleField *)0x0, rhs_03.list_ = pMVar1,
        bVar12 = intrusive_list<wabt::ModuleField>::const_iterator::operator!=
                           ((const_iterator *)local_438,rhs_03), bVar12) {
    pMVar14 = intrusive_list<wabt::ModuleField>::const_iterator::operator*
                        ((const_iterator *)local_438);
    if (pMVar14->type_ == Memory) {
      RVar13 = SharedValidator::OnMemory
                         (this_00,&pMVar14->loc,(Limits *)&pMVar14[1].loc.filename.size_);
      (this->result_).enum_ = (uint)(RVar13.enum_ == Error || (this->result_).enum_ == Error);
    }
    intrusive_list<wabt::ModuleField>::const_iterator::operator++((const_iterator *)local_438);
  }
  local_450.node_ = pMVar1->first_;
  local_450.list_ = pMVar1;
  while (rhs_04.node_ = (ModuleField *)0x0, rhs_04.list_ = pMVar1,
        bVar12 = intrusive_list<wabt::ModuleField>::const_iterator::operator!=(&local_450,rhs_04),
        bVar12) {
    pMVar14 = intrusive_list<wabt::ModuleField>::const_iterator::operator*(&local_450);
    if (pMVar14->type_ == Global) {
      RVar13 = SharedValidator::OnGlobal
                         (this_00,&pMVar14->loc,(Type)(Enum)pMVar14[1].loc.filename.size_,
                          *(bool *)((long)&pMVar14[1].loc.filename.size_ + 4));
      (this->result_).enum_ = (uint)(RVar13.enum_ == Error || (this->result_).enum_ == Error);
      if (*(long *)&pMVar14[1].type_ == 1) {
        pvVar23 = intrusive_list<wabt::Expr>::front
                            ((intrusive_list<wabt::Expr> *)&pMVar14[1].loc.field_1.field_0);
        EVar3 = pvVar23->type_;
        if (EVar3 != RefNull) {
          if (EVar3 == GlobalGet) {
            pVVar25 = cast<wabt::VarExpr<(wabt::ExprType)19>,wabt::Expr>(pvVar23);
            pVVar28 = (Var *)local_438;
            Var::Var(pVVar28,&pVVar25->var);
            Var::Var(&local_150,pVVar28);
            RVar13 = SharedValidator::OnGlobalInitExpr_GlobalGet(this_00,&pvVar23->loc,&local_150);
            (this->result_).enum_ = (uint)(RVar13.enum_ == Error || (this->result_).enum_ == Error);
            Var::~Var(&local_150);
          }
          else {
            if (EVar3 != RefFunc) {
              if (EVar3 != Const) goto LAB_0015b286;
              pCVar24 = cast<wabt::ConstExpr,wabt::Expr>(pvVar23);
              RVar13 = SharedValidator::OnGlobalInitExpr_Const
                                 (this_00,&pvVar23->loc,(Type)(pCVar24->const_).type_.enum_);
              goto LAB_0015b28e;
            }
            pVVar26 = cast<wabt::VarExpr<(wabt::ExprType)35>,wabt::Expr>(pvVar23);
            pVVar28 = &local_198;
            Var::Var(pVVar28,&pVVar26->var);
            RVar13 = SharedValidator::OnGlobalInitExpr_RefFunc(this_00,&pvVar23->loc,pVVar28);
            (this->result_).enum_ = (uint)(RVar13.enum_ == Error || (this->result_).enum_ == Error);
          }
          Var::~Var(pVVar28);
          goto LAB_0015b36a;
        }
        pRVar27 = cast<wabt::RefTypeExpr<(wabt::ExprType)36>,wabt::Expr>(pvVar23);
        RVar13 = SharedValidator::OnGlobalInitExpr_RefNull
                           (this_00,&pvVar23->loc,(Type)(pRVar27->type).enum_);
      }
      else {
LAB_0015b286:
        RVar13 = SharedValidator::OnGlobalInitExpr_Other(this_00,&pMVar14->loc);
      }
LAB_0015b28e:
      (this->result_).enum_ = (uint)(RVar13.enum_ == Error || (this->result_).enum_ == Error);
    }
LAB_0015b36a:
    intrusive_list<wabt::ModuleField>::const_iterator::operator++(&local_450);
  }
  local_438._8_8_ = pMVar1->first_;
  local_438._0_8_ = pMVar1;
  while (rhs_05.node_ = (ModuleField *)0x0, rhs_05.list_ = pMVar1,
        bVar12 = intrusive_list<wabt::ModuleField>::const_iterator::operator!=
                           ((const_iterator *)local_438,rhs_05), bVar12) {
    pMVar14 = intrusive_list<wabt::ModuleField>::const_iterator::operator*
                        ((const_iterator *)local_438);
    if (pMVar14->type_ == Event) {
      GetFuncTypeIndex(&local_1e0,this,&pMVar14->loc,
                       (FuncDeclaration *)&pMVar14[1].loc.filename.size_);
      RVar13 = SharedValidator::OnEvent(this_00,&pMVar14->loc,&local_1e0);
      (this->result_).enum_ = (uint)(RVar13.enum_ == Error || (this->result_).enum_ == Error);
      Var::~Var(&local_1e0);
    }
    intrusive_list<wabt::ModuleField>::const_iterator::operator++((const_iterator *)local_438);
  }
  local_438._8_8_ = pMVar1->first_;
  local_438._0_8_ = pMVar1;
  while( true ) {
    rhs_06.node_ = (ModuleField *)0x0;
    rhs_06.list_ = pMVar1;
    bVar12 = intrusive_list<wabt::ModuleField>::const_iterator::operator!=
                       ((const_iterator *)local_438,rhs_06);
    if (!bVar12) break;
    pMVar14 = intrusive_list<wabt::ModuleField>::const_iterator::operator*
                        ((const_iterator *)local_438);
    if (pMVar14->type_ == Export) {
      sVar10 = pMVar14[1].loc.filename.size_;
      Var::Var(&local_228,(Var *)&pMVar14[1].loc.field_1.field_0);
      name.data_ = (char *)pMVar14[1]._vptr_ModuleField;
      name.size_ = (size_type)pMVar14[1].super_intrusive_list_base<wabt::ModuleField>.next_;
      RVar13 = SharedValidator::OnExport(this_00,&pMVar14->loc,(ExternalKind)sVar10,&local_228,name)
      ;
      (this->result_).enum_ = (uint)(RVar13.enum_ == Error || (this->result_).enum_ == Error);
      Var::~Var(&local_228);
    }
    intrusive_list<wabt::ModuleField>::const_iterator::operator++((const_iterator *)local_438);
  }
  local_438._8_8_ = pMVar1->first_;
  local_438._0_8_ = pMVar1;
  while (rhs_07.node_ = (ModuleField *)0x0, rhs_07.list_ = pMVar1,
        bVar12 = intrusive_list<wabt::ModuleField>::const_iterator::operator!=
                           ((const_iterator *)local_438,rhs_07), bVar12) {
    pMVar14 = intrusive_list<wabt::ModuleField>::const_iterator::operator*
                        ((const_iterator *)local_438);
    if (pMVar14->type_ == Start) {
      Var::Var(&local_270,(Var *)(pMVar14 + 1));
      RVar13 = SharedValidator::OnStart(this_00,&pMVar14->loc,&local_270);
      (this->result_).enum_ = (uint)(RVar13.enum_ == Error || (this->result_).enum_ == Error);
      Var::~Var(&local_270);
    }
    intrusive_list<wabt::ModuleField>::const_iterator::operator++((const_iterator *)local_438);
  }
  local_450.node_ = pMVar1->first_;
  local_450.list_ = pMVar1;
  while( true ) {
    rhs_08.node_ = (ModuleField *)0x0;
    rhs_08.list_ = pMVar1;
    bVar12 = intrusive_list<wabt::ModuleField>::const_iterator::operator!=(&local_450,rhs_08);
    pMVar11 = local_3e0;
    if (!bVar12) break;
    pMVar14 = intrusive_list<wabt::ModuleField>::const_iterator::operator*(&local_450);
    if (pMVar14->type_ == ElemSegment) {
      pLVar29 = &pMVar14->loc;
      Var::Var(&local_2b8,(Var *)&pMVar14[1].loc.field_1.field_0);
      RVar13 = SharedValidator::OnElemSegment
                         (this_00,pLVar29,&local_2b8,*(SegmentKind *)&pMVar14[1]._vptr_ModuleField);
      (this->result_).enum_ = (uint)(RVar13.enum_ == Error || (this->result_).enum_ == Error);
      Var::~Var(&local_2b8);
      SharedValidator::OnElemSegmentElemType
                (this_00,(Type)pMVar14[2].loc.field_1.field_0.last_column);
      pMVar32 = pMVar14[3].super_intrusive_list_base<wabt::ModuleField>.next_;
      if (pMVar32 != (ModuleField *)0x0) {
        if (pMVar32 == (ModuleField *)0x1) {
          pvVar23 = intrusive_list<wabt::Expr>::front
                              ((intrusive_list<wabt::Expr> *)&pMVar14[2].type_);
          if (pvVar23->type_ == GlobalGet) {
            pVVar25 = cast<wabt::VarExpr<(wabt::ExprType)19>,wabt::Expr>(pvVar23);
            Var::Var((Var *)local_438,&pVVar25->var);
            Var::Var(&local_3d8,(Var *)local_438);
            RVar13 = SharedValidator::OnElemSegmentInitExpr_GlobalGet
                               (this_00,&pvVar23->loc,&local_3d8);
            (this->result_).enum_ = (uint)(RVar13.enum_ == Error || (this->result_).enum_ == Error);
            Var::~Var(&local_3d8);
            Var::~Var((Var *)local_438);
            goto LAB_0015b687;
          }
          if (pvVar23->type_ != Const) goto LAB_0015b661;
          pCVar24 = cast<wabt::ConstExpr,wabt::Expr>(pvVar23);
          RVar13 = SharedValidator::OnElemSegmentInitExpr_Const
                             (this_00,&pvVar23->loc,(Type)(pCVar24->const_).type_.enum_);
        }
        else {
LAB_0015b661:
          RVar13 = SharedValidator::OnElemSegmentInitExpr_Other(this_00,pLVar29);
        }
        (this->result_).enum_ = (uint)(RVar13.enum_ == Error || (this->result_).enum_ == Error);
      }
LAB_0015b687:
      pMVar6 = (ModuleField *)pMVar14[3].loc.filename.data_;
      for (pMVar32 = pMVar14[3].super_intrusive_list_base<wabt::ModuleField>.prev_;
          pMVar32 != pMVar6; pMVar32 = (ModuleField *)&pMVar32[1].loc) {
        if (*(int *)&pMVar32->_vptr_ModuleField == 1) {
          Var::Var(&local_300,(Var *)&pMVar32->super_intrusive_list_base<wabt::ModuleField>);
          RVar13 = SharedValidator::OnElemSegmentElemExpr_RefFunc
                             (this_00,(Location *)
                                      &pMVar32->super_intrusive_list_base<wabt::ModuleField>,
                              &local_300);
          (this->result_).enum_ = (uint)(RVar13.enum_ == Error || (this->result_).enum_ == Error);
          Var::~Var(&local_300);
        }
        else if (*(int *)&pMVar32->_vptr_ModuleField == 0) {
          RVar13 = SharedValidator::OnElemSegmentElemExpr_RefNull
                             (this_00,pLVar29,
                              (Type)*(Enum *)&pMVar32[1].
                                              super_intrusive_list_base<wabt::ModuleField>.prev_);
          (this->result_).enum_ = (uint)(RVar13.enum_ == Error || (this->result_).enum_ == Error);
        }
      }
    }
    intrusive_list<wabt::ModuleField>::const_iterator::operator++(&local_450);
  }
  SharedValidator::OnDataCount
            (this_00,(Index)((ulong)((long)(local_3e0->data_segments).
                                           super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(local_3e0->data_segments).
                                          super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>
                                          ._M_impl.super__Vector_impl_data._M_start) >> 3));
  local_460 = pMVar11->num_func_imports;
  local_450.node_ = (pMVar11->fields).first_;
  local_450.list_ = pMVar1;
  while (rhs_09.node_ = (ModuleField *)0x0, rhs_09.list_ = pMVar1,
        bVar12 = intrusive_list<wabt::ModuleField>::const_iterator::operator!=(&local_450,rhs_09),
        bVar12) {
    pMVar14 = intrusive_list<wabt::ModuleField>::const_iterator::operator*(&local_450);
    if (pMVar14->type_ == Func) {
      pLVar29 = &pMVar14->loc;
      RVar13 = SharedValidator::BeginFunctionBody(this_00,pLVar29,local_460);
      (this->result_).enum_ = (uint)(RVar13.enum_ == Error || (this->result_).enum_ == Error);
      pEVar7 = (Enum *)pMVar14[3].loc.field_1.field_1.offset;
      for (pEVar31 = (Enum *)pMVar14[3].loc.filename.size_; pEVar31 != pEVar7; pEVar31 = pEVar31 + 2
          ) {
        RVar13 = SharedValidator::OnLocalDecl(this_00,pLVar29,pEVar31[1],(Type)*pEVar31);
        (this->result_).enum_ = (uint)(RVar13.enum_ == Error || (this->result_).enum_ == Error);
      }
      local_460 = local_460 + 1;
      ExprVisitor::ExprVisitor((ExprVisitor *)local_438,&this->super_Delegate);
      RVar13 = ExprVisitor::VisitExprList
                         ((ExprVisitor *)local_438,(ExprList *)((long)&pMVar14[4].loc.field_1 + 8));
      (this->result_).enum_ = (uint)(RVar13.enum_ == Error || (this->result_).enum_ == Error);
      RVar13 = SharedValidator::EndFunctionBody(this_00,pLVar29);
      (this->result_).enum_ = (uint)(RVar13.enum_ == Error || (this->result_).enum_ == Error);
      ExprVisitor::~ExprVisitor((ExprVisitor *)local_438);
    }
    intrusive_list<wabt::ModuleField>::const_iterator::operator++(&local_450);
  }
  local_450.node_ = pMVar1->first_;
  local_450.list_ = pMVar1;
  do {
    rhs_10.node_ = (ModuleField *)0x0;
    rhs_10.list_ = pMVar1;
    bVar12 = intrusive_list<wabt::ModuleField>::const_iterator::operator!=(&local_450,rhs_10);
    if (!bVar12) {
      RVar13 = SharedValidator::EndModule(this_00);
      RVar13.enum_._0_1_ = RVar13.enum_ == Error || (this->result_).enum_ == Error;
      RVar13.enum_._1_3_ = 0;
      (this->result_).enum_ = RVar13.enum_;
      return (Result)RVar13.enum_;
    }
    pMVar14 = intrusive_list<wabt::ModuleField>::const_iterator::operator*(&local_450);
    if (pMVar14->type_ == DataSegment) {
      Var::Var(&local_348,(Var *)&pMVar14[1].loc.field_1.field_0);
      RVar13 = SharedValidator::OnDataSegment
                         (this_00,&pMVar14->loc,&local_348,
                          *(SegmentKind *)&pMVar14[1]._vptr_ModuleField);
      (this->result_).enum_ = (uint)(RVar13.enum_ == Error || (this->result_).enum_ == Error);
      Var::~Var(&local_348);
      if (pMVar14[3]._vptr_ModuleField != (_func_int **)0x0) {
        if (pMVar14[3]._vptr_ModuleField == (_func_int **)0x1) {
          pvVar23 = intrusive_list<wabt::Expr>::front
                              ((intrusive_list<wabt::Expr> *)((long)&pMVar14[2].loc.field_1 + 8));
          if (pvVar23->type_ == GlobalGet) {
            pVVar25 = cast<wabt::VarExpr<(wabt::ExprType)19>,wabt::Expr>(pvVar23);
            Var::Var((Var *)local_438,&pVVar25->var);
            Var::Var(&local_390,(Var *)local_438);
            RVar13 = SharedValidator::OnDataSegmentInitExpr_GlobalGet
                               (this_00,&pvVar23->loc,&local_390);
            (this->result_).enum_ = (uint)(RVar13.enum_ == Error || (this->result_).enum_ == Error);
            Var::~Var(&local_390);
            Var::~Var((Var *)local_438);
            goto LAB_0015ba20;
          }
          if (pvVar23->type_ != Const) goto LAB_0015b9f9;
          pCVar24 = cast<wabt::ConstExpr,wabt::Expr>(pvVar23);
          RVar13 = SharedValidator::OnDataSegmentInitExpr_Const
                             (this_00,&pvVar23->loc,(Type)(pCVar24->const_).type_.enum_);
        }
        else {
LAB_0015b9f9:
          RVar13 = SharedValidator::OnDataSegmentInitExpr_Other(this_00,&pMVar14->loc);
        }
        (this->result_).enum_ = (uint)(RVar13.enum_ == Error || (this->result_).enum_ == Error);
      }
    }
LAB_0015ba20:
    intrusive_list<wabt::ModuleField>::const_iterator::operator++(&local_450);
  } while( true );
}

Assistant:

Result Validator::CheckModule() {
  const Module* module = current_module_;

  // Type section.
  for (const ModuleField& field : module->fields) {
    if (auto* f = dyn_cast<TypeModuleField>(&field)) {
      switch (f->type->kind()) {
        case TypeEntryKind::Func: {
          FuncType* func_type = cast<FuncType>(f->type.get());
          result_ |= validator_.OnFuncType(field.loc,
                                           func_type->sig.param_types.size(),
                                           func_type->sig.param_types.data(),
                                           func_type->sig.result_types.size(),
                                           func_type->sig.result_types.data());
          break;
        }

        case TypeEntryKind::Struct: {
          StructType* struct_type = cast<StructType>(f->type.get());
          TypeMutVector type_muts;
          for (auto&& field : struct_type->fields) {
            type_muts.push_back(TypeMut{field.type, field.mutable_});
          }
          result_ |= validator_.OnStructType(field.loc, type_muts.size(),
                                             type_muts.data());
          break;
        }

        case TypeEntryKind::Array: {
          ArrayType* array_type = cast<ArrayType>(f->type.get());
          result_ |= validator_.OnArrayType(
              field.loc,
              TypeMut{array_type->field.type, array_type->field.mutable_});
          break;
        }
      }
    }
  }

  // Import section.
  for (const ModuleField& field : module->fields) {
    if (auto* f = dyn_cast<ImportModuleField>(&field)) {
      switch (f->import->kind()) {
        case ExternalKind::Func: {
          auto&& func = cast<FuncImport>(f->import.get())->func;
          result_ |= validator_.OnFunction(
              field.loc, GetFuncTypeIndex(field.loc, func.decl));
          break;
        }

        case ExternalKind::Table: {
          auto&& table = cast<TableImport>(f->import.get())->table;
          result_ |=
              validator_.OnTable(field.loc, table.elem_type, table.elem_limits);
          break;
        }

        case ExternalKind::Memory: {
          auto&& memory = cast<MemoryImport>(f->import.get())->memory;
          result_ |= validator_.OnMemory(field.loc, memory.page_limits);
          break;
        }

        case ExternalKind::Global: {
          auto&& global = cast<GlobalImport>(f->import.get())->global;
          result_ |= validator_.OnGlobalImport(field.loc, global.type,
                                               global.mutable_);
          break;
        }

        case ExternalKind::Event: {
          auto&& event = cast<EventImport>(f->import.get())->event;
          result_ |= validator_.OnEvent(
              field.loc, GetFuncTypeIndex(field.loc, event.decl));
          break;
        }
      }
    }
  }

  // Func section.
  for (const ModuleField& field : module->fields) {
    if (auto* f = dyn_cast<FuncModuleField>(&field)) {
      result_ |= validator_.OnFunction(
          field.loc, GetFuncTypeIndex(field.loc, f->func.decl));
    }
  }

  // Table section.
  for (const ModuleField& field : module->fields) {
    if (auto* f = dyn_cast<TableModuleField>(&field)) {
      result_ |= validator_.OnTable(field.loc, f->table.elem_type,
                                    f->table.elem_limits);
    }
  }

  // Memory section.
  for (const ModuleField& field : module->fields) {
    if (auto* f = dyn_cast<MemoryModuleField>(&field)) {
      result_ |= validator_.OnMemory(field.loc, f->memory.page_limits);
    }
  }

  // Global section.
  for (const ModuleField& field : module->fields) {
    if (auto* f = dyn_cast<GlobalModuleField>(&field)) {
      result_ |=
          validator_.OnGlobal(field.loc, f->global.type, f->global.mutable_);

      if (f->global.init_expr.size() == 1) {
        const Expr* expr = &f->global.init_expr.front();

        switch (expr->type()) {
          case ExprType::Const:
            result_ |= validator_.OnGlobalInitExpr_Const(
                expr->loc, cast<ConstExpr>(expr)->const_.type());
            break;

          case ExprType::GlobalGet: {
            Var var = cast<GlobalGetExpr>(expr)->var;
            result_ |= validator_.OnGlobalInitExpr_GlobalGet(expr->loc, var);
            break;
          }

          case ExprType::RefFunc:
            result_ |= validator_.OnGlobalInitExpr_RefFunc(
                expr->loc, cast<RefFuncExpr>(expr)->var);
            break;

          case ExprType::RefNull:
            result_ |= validator_.OnGlobalInitExpr_RefNull(
                expr->loc, cast<RefNullExpr>(expr)->type);
            break;

          default:
            result_ |= validator_.OnGlobalInitExpr_Other(field.loc);
            break;
        }
      } else {
        result_ |= validator_.OnGlobalInitExpr_Other(field.loc);
      }
    }
  }

  // Event section.
  for (const ModuleField& field : module->fields) {
    if (auto* f = dyn_cast<EventModuleField>(&field)) {
      result_ |= validator_.OnEvent(field.loc,
                                    GetFuncTypeIndex(field.loc, f->event.decl));
    }
  }

  // Export section.
  for (const ModuleField& field : module->fields) {
    if (auto* f = dyn_cast<ExportModuleField>(&field)) {
      result_ |= validator_.OnExport(field.loc, f->export_.kind, f->export_.var,
                                     f->export_.name);
    }
  }

  // Start section.
  for (const ModuleField& field : module->fields) {
    if (auto* f = dyn_cast<StartModuleField>(&field)) {
      result_ |= validator_.OnStart(field.loc, f->start);
    }
  }

  // Elem segment section.
  for (const ModuleField& field : module->fields) {
    if (auto* f = dyn_cast<ElemSegmentModuleField>(&field)) {
      result_ |= validator_.OnElemSegment(field.loc, f->elem_segment.table_var,
                                          f->elem_segment.kind);

      validator_.OnElemSegmentElemType(f->elem_segment.elem_type);

      // Init expr.
      if (f->elem_segment.offset.size() == 1) {
        const Expr* expr = &f->elem_segment.offset.front();

        switch (expr->type()) {
          case ExprType::Const:
            result_ |= validator_.OnElemSegmentInitExpr_Const(
                expr->loc, cast<ConstExpr>(expr)->const_.type());
            break;

          case ExprType::GlobalGet: {
            Var var = cast<GlobalGetExpr>(expr)->var;
            result_ |=
                validator_.OnElemSegmentInitExpr_GlobalGet(expr->loc, var);
            break;
          }

          default:
            result_ |= validator_.OnElemSegmentInitExpr_Other(field.loc);
            break;
        }
      } else if (f->elem_segment.offset.size() > 1) {
        result_ |= validator_.OnElemSegmentInitExpr_Other(field.loc);
      }

      // Element expr.
      for (auto&& elem_expr : f->elem_segment.elem_exprs) {
        switch (elem_expr.kind) {
          case ElemExprKind::RefNull:
            // TODO: better location?
            result_ |= validator_.OnElemSegmentElemExpr_RefNull(field.loc,
                                                                elem_expr.type);
            break;

          case ElemExprKind::RefFunc:
            result_ |= validator_.OnElemSegmentElemExpr_RefFunc(
                elem_expr.var.loc, elem_expr.var);
            break;
        }
      }
    }
  }

  // DataCount section.
  validator_.OnDataCount(module->data_segments.size());

  // Code section.
  Index func_index = module->num_func_imports;
  for (const ModuleField& field : module->fields) {
    if (auto* f = dyn_cast<FuncModuleField>(&field)) {
      result_ |= validator_.BeginFunctionBody(field.loc, func_index++);

      for (auto&& decl : f->func.local_types.decls()) {
        // TODO: Better location?
        result_ |= validator_.OnLocalDecl(field.loc, decl.second, decl.first);
      }

      ExprVisitor visitor(this);
      result_ |= visitor.VisitExprList(const_cast<ExprList&>(f->func.exprs));
      result_ |= validator_.EndFunctionBody(field.loc);
    }
  }

  // Data segment section.
  for (const ModuleField& field : module->fields) {
    if (auto* f = dyn_cast<DataSegmentModuleField>(&field)) {
      result_ |= validator_.OnDataSegment(
          field.loc, f->data_segment.memory_var, f->data_segment.kind);

      // Init expr.
      if (f->data_segment.offset.size() == 1) {
        const Expr* expr = &f->data_segment.offset.front();

        switch (expr->type()) {
          case ExprType::Const:
            result_ |= validator_.OnDataSegmentInitExpr_Const(
                expr->loc, cast<ConstExpr>(expr)->const_.type());
            break;

          case ExprType::GlobalGet: {
            Var var = cast<GlobalGetExpr>(expr)->var;
            result_ |=
                validator_.OnDataSegmentInitExpr_GlobalGet(expr->loc, var);
            break;
          }

          default:
            result_ |= validator_.OnDataSegmentInitExpr_Other(field.loc);
            break;
        }
      } else if (f->data_segment.offset.size() > 1) {
        result_ |= validator_.OnDataSegmentInitExpr_Other(field.loc);
      }
    }
  }

  result_ |= validator_.EndModule();

  return result_;
}